

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

StringPtr *
kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>
::FindOrCreateImpl<kj::_::(anonymous_namespace)::TestCase29::run()::$_1,kj::StringPtr&>::apply<0ul>
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          StringPtr *params,Type *createFunc)

{
  bool bVar1;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar2;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar3;
  Type_conflict4 *func;
  ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table_00;
  Maybe<unsigned_long> local_f8;
  long local_e8;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_e0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *local_d8;
  StringPtr *local_d0;
  undefined1 local_c8 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:644:7)>
  _kjDefer649;
  StringPtr *newRow;
  undefined4 local_70;
  bool success;
  ArrayPtr<kj::HashMap<kj::String,_int>::Entry> local_60;
  Maybe<unsigned_long> local_50;
  undefined1 local_40 [8];
  NullableValue<unsigned_long> existing;
  size_t pos;
  Type *createFunc_local;
  StringPtr *params_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table_local;
  
  existing.field_1.value =
       Vector<kj::HashMap<kj::String,_int>::Entry>::size
                 ((Vector<kj::HashMap<kj::String,_int>::Entry> *)table);
  pHVar2 = get<0ul,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>&>(&table->indexes);
  local_60 = Vector<kj::HashMap<kj::String,_int>::Entry>::asPtr
                       ((Vector<kj::HashMap<kj::String,_int>::Entry> *)table);
  table_00.size_ = (size_t)local_60.ptr;
  table_00.ptr = (StringPtr *)pHVar2;
  HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
  insert<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
            ((HashIndex<kj::HashMap<kj::String,int>::Callbacks> *)&local_50,table_00,local_60.size_,
             (StringPtr *)existing.field_1);
  other = _::readMaybe<unsigned_long>(&local_50);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_40,other);
  Maybe<unsigned_long>::~Maybe(&local_50);
  puVar3 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_40);
  if (puVar3 == (unsigned_long *)0x0) {
    newRow._7_1_ = 0;
    NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/map-test.c++:47:3)>
    ::Type::operator()(&_kjDefer649.canceled);
    table_local = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                   *)Vector<kj::HashMap<kj::String,int>::Entry>::
                     add<kj::HashMap<kj::String,int>::Entry>
                               ((Vector<kj::HashMap<kj::String,int>::Entry> *)table,
                                (StringPtr *)&_kjDefer649.canceled);
    HashMap<kj::String,_int>::Entry::~Entry((Entry *)&_kjDefer649.canceled);
    local_e8 = (long)&newRow + 7;
    local_d8 = &existing.field_1;
    local_e0 = table;
    local_d0 = params;
    defer<kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>::FindOrCreateImpl<kj::_::(anonymous_namespace)::TestCase29::run()::__1,kj::StringPtr&>::apply<0ul>(kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>&,kj::StringPtr&,kj::_::(anonymous_namespace)::TestCase29::run()::__1&&)::_lambda()_1_>
              ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:644:7)>
                *)local_c8,(kj *)&local_e8,func);
    Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
    ::Impl<0UL,_false>::insert
              ((Impl<0UL,_false> *)&local_f8,table,existing.field_1.value,(StringPtr *)table_local,0
              );
    bVar1 = Maybe<unsigned_long>::operator==(&local_f8,(void *)0x0);
    Maybe<unsigned_long>::~Maybe(&local_f8);
    if (!bVar1) {
      _::throwDuplicateTableRow();
    }
    newRow._7_1_ = 1;
    local_70 = 1;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.h:644:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:644:7)>
                 *)local_c8);
  }
  else {
    puVar3 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_40);
    table_local = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                   *)Vector<kj::HashMap<kj::String,_int>::Entry>::operator[]
                               ((Vector<kj::HashMap<kj::String,_int>::Entry> *)table,*puVar3);
    local_70 = 1;
  }
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_40);
  return (StringPtr *)table_local;
}

Assistant:

static Row& apply(Table<Row, Indexes...>& table, Params&&... params, Func&& createFunc) {
    auto pos = table.rows.size();
    KJ_IF_MAYBE(existing, get<index>(table.indexes).insert(table.rows.asPtr(), pos, params...)) {
      return table.rows[*existing];
    } else {
      bool success = false;
      auto& newRow = table.rows.add(createFunc());
      KJ_DEFER({
        if (!success) {
          table.rows.removeLast();
          get<index>(table.indexes).erase(table.rows.asPtr(), pos, params...);
        }
      });
      if (Table<Row, Indexes...>::template Impl<>::insert(table, pos, newRow, index) == nullptr) {
        success = true;
      } else {
        _::throwDuplicateTableRow();
      }
      return newRow;
    }